

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EfiTianoCompressLegacy.c
# Opt level: O0

void GetNextMatch(void)

{
  INT32 IVar1;
  INT32 Number;
  
  mRemainder = mRemainder + -1;
  mPos = mPos + 1;
  if (mPos == 0x100000) {
    memmove(mText,mText + 0x80000,0x80100);
    IVar1 = FreadCrc(mText + 0x80100,0x80000);
    mRemainder = IVar1 + mRemainder;
    mPos = 0x80000;
  }
  DeleteNode();
  InsertNode();
  return;
}

Assistant:

STATIC
  VOID
  GetNextMatch (
  VOID
  )
  /*++

  Routine Description:

  Advance the current position (read new data if needed).
  Delete outdated string info. Find a match string for current position.

  Arguments: (VOID)

  Returns: (VOID)

  --*/
{
  INT32 Number;

  mRemainder--;
  mPos++;
  if (mPos == WNDSIZ * 2) {
    memmove (&mText[0], &mText[WNDSIZ], WNDSIZ + MAXMATCH);
    Number = FreadCrc (&mText[WNDSIZ + MAXMATCH], WNDSIZ);
    mRemainder += Number;
    mPos = WNDSIZ;
  }

  DeleteNode ();
  InsertNode ();
}